

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.c
# Opt level: O3

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  void *__ptr;
  char decoded [16];
  ggwave_Parameters parameters;
  int local_58;
  undefined1 local_54;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  ggwave_setLogFile(_stdout);
  ggwave_getDefaultParameters(local_48);
  uStack_30 = 0x400000004;
  uStack_30._0_4_ = 4;
  uVar4 = (undefined4)uStack_30;
  uVar1 = ggwave_init();
  iVar2 = ggwave_encode(uVar1,"test",4,2,0x32,0,1,uStack_40,local_38,uVar4,local_28);
  __ptr = malloc((long)iVar2);
  if (__ptr == (void *)0x0) {
    main_cold_8();
LAB_00101573:
    main_cold_1();
LAB_00101578:
    main_cold_2();
LAB_0010157d:
    main_cold_3();
LAB_00101582:
    main_cold_4();
LAB_00101587:
    main_cold_5();
  }
  else {
    iVar2 = ggwave_encode(uVar1,"test",4,2,0x32,__ptr,0,uStack_40,local_38,uVar4,local_28);
    if (iVar2 < 1) goto LAB_00101573;
    iVar3 = ggwave_ndecode(uVar1,__ptr,iVar2,&local_58,3);
    if (iVar3 != -2) goto LAB_00101578;
    iVar3 = ggwave_ndecode(uVar1,__ptr,iVar2,&local_58,4);
    if (iVar3 != 4) goto LAB_0010157d;
    iVar3 = ggwave_decode(uVar1,__ptr,iVar2,&local_58);
    if (iVar3 != 4) goto LAB_00101582;
    ggwave_rxToggleProtocol(2,0);
    uVar4 = ggwave_init();
    iVar3 = ggwave_ndecode(uVar4,__ptr,iVar2,&local_58,4);
    if (iVar3 != -1) goto LAB_00101587;
    ggwave_free(uVar4);
    ggwave_rxToggleProtocol(2,1);
    uVar4 = ggwave_init();
    iVar2 = ggwave_ndecode(uVar4,__ptr,iVar2,&local_58,4);
    if (iVar2 == 4) {
      ggwave_free(uVar4);
      local_54 = 0;
      if (local_58 == 0x74736574) {
        ggwave_free(uVar1);
        free(__ptr);
        return 0;
      }
      goto LAB_00101591;
    }
  }
  main_cold_6();
LAB_00101591:
  main_cold_7();
  halt_baddata();
}

Assistant:

int main() {
    //ggwave_setLogFile(NULL); // disable logging
    ggwave_setLogFile(stdout);

    ggwave_Parameters parameters = ggwave_getDefaultParameters();
    parameters.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16;
    parameters.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16;

    ggwave_Instance instance = ggwave_init(parameters);

    int ret;
    const char * payload = "test";
    char decoded[16];

    int n = ggwave_encode(instance, payload, 4, GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 50, NULL, 1);
    char *waveform = malloc(n);
    CHECK(waveform != NULL);

    int ne = ggwave_encode(instance, payload, 4, GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 50, waveform, 0);
    CHECK(ne > 0);

    // not enough output buffer size to store the decoded message
    ret = ggwave_ndecode(instance, waveform, ne, decoded, 3);
    CHECK(ret == -2); // fail

    // just enough size to store it
    ret = ggwave_ndecode(instance, waveform, ne, decoded, 4);
    CHECK(ret == 4); // success

    // unsafe method - will write the decoded output to the output buffer regardless of the size
    ret = ggwave_decode(instance, waveform, ne, decoded);
    CHECK(ret == 4);

    // disable Rx protocol
    {
        ggwave_rxToggleProtocol(GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 0);
        ggwave_Instance instanceTmp = ggwave_init(parameters);

        ret = ggwave_ndecode(instanceTmp, waveform, ne, decoded, 4);
        CHECK(ret == -1); // fail

        ggwave_free(instanceTmp);
    }

    // enable Rx protocol
    {
        ggwave_rxToggleProtocol(GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 1);
        ggwave_Instance instanceTmp = ggwave_init(parameters);

        ret = ggwave_ndecode(instanceTmp, waveform, ne, decoded, 4);
        CHECK(ret == 4); // success

        ggwave_free(instanceTmp);
    }

    decoded[ret] = 0; // null-terminate the received data
    CHECK(strcmp(decoded, payload) == 0);

    ggwave_free(instance);
    free(waveform);

    return 0;
}